

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  long *in_RDX;
  long *in_RSI;
  binary_op_add *this;
  long *in_RDI;
  bool bVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _outp_1;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  __m256 *in_stack_fffffffffffffa80;
  __m256 *x;
  Allocator *in_stack_fffffffffffffa98;
  Mat *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  float local_4e0 [2];
  float afStack_4d8 [2];
  float local_4d0 [2];
  float afStack_4c8 [2];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  int local_44c;
  float local_448 [8];
  long local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined8 local_408;
  binary_op_add *local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  long local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined8 local_3b8;
  float *local_3b0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined4 local_380;
  long local_378;
  undefined4 local_370;
  undefined4 local_36c;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined8 local_358;
  float *local_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  binary_op_add local_329 [9];
  long *local_320;
  long *local_318;
  long *local_310;
  int local_304;
  long *local_300;
  undefined1 local_2f5;
  int local_2f4;
  undefined8 *local_2e8;
  undefined1 local_2dd;
  int local_2dc;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2a8;
  undefined8 *local_298;
  __m256 *local_288;
  undefined1 local_275;
  int local_274;
  float *local_268;
  float *local_258;
  float *local_250;
  float *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  binary_op_add *local_218;
  float *local_210;
  float *local_208;
  undefined8 local_200;
  float afStack_1f8 [2];
  binary_op_add *local_1f0;
  long *local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  binary_op_add *local_1c8;
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  float *local_1b0;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  float *local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  long local_170;
  undefined4 local_164;
  long local_160;
  float *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  undefined4 local_134;
  long local_130;
  undefined4 local_124;
  long local_120;
  undefined4 local_114;
  long local_110;
  __m256 *local_e0;
  undefined8 *local_c0;
  undefined8 *local_a0;
  
  local_330 = *(int *)((long)in_RDI + 0x2c);
  local_334 = (int)in_RDI[6];
  local_338 = *(int *)((long)in_RDI + 0x34);
  local_33c = (int)in_RDI[7];
  local_340 = (int)in_RDI[3];
  local_344 = local_330 * local_334 * local_338 * local_340;
  local_320 = in_RDX;
  local_318 = in_RSI;
  local_310 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_300 = local_320;
  bVar3 = true;
  if (*local_320 != 0) {
    local_1e8 = local_320;
    bVar3 = local_320[8] * (long)(int)local_320[7] == 0;
  }
  if (bVar3) {
    local_304 = -100;
  }
  else {
    for (local_348 = 0; local_348 < local_33c; local_348 = local_348 + 1) {
      local_2d0 = &local_398;
      local_17c = *(int *)((long)local_310 + 0x2c);
      local_180 = (int)local_310[6];
      local_184 = *(undefined4 *)((long)local_310 + 0x34);
      local_350 = (float *)(*local_310 + local_310[8] * (long)local_348 * local_310[2]);
      local_198 = local_310[2];
      local_19c = (undefined4)local_310[3];
      local_1a8 = local_310[4];
      local_178 = &local_398;
      local_120 = (long)local_17c * (long)local_180 * local_198;
      local_2c0 = &local_398;
      local_2a8 = &local_398;
      local_2e8 = &local_3f8;
      local_144 = *(int *)((long)local_318 + 0x2c);
      local_148 = (int)local_318[6];
      local_14c = *(undefined4 *)((long)local_318 + 0x34);
      local_3b0 = (float *)(*local_318 + local_318[8] * (long)local_348 * local_318[2]);
      local_160 = local_318[2];
      local_164 = (undefined4)local_318[3];
      local_170 = local_318[4];
      local_140 = &local_3f8;
      local_130 = (long)local_144 * (long)local_148 * local_160;
      local_2c8 = &local_3f8;
      local_298 = &local_3f8;
      local_268 = local_448;
      local_1b4 = *(int *)((long)local_320 + 0x2c);
      local_1b8 = (int)local_320[6];
      local_1bc = *(undefined4 *)((long)local_320 + 0x34);
      this = (binary_op_add *)(*local_320 + local_320[8] * (long)local_348 * local_320[2]);
      local_1d0 = local_320[2];
      local_1d4 = (undefined4)local_320[3];
      local_1e0 = local_320[4];
      local_1b0 = local_448;
      local_110 = (long)local_1b4 * (long)local_1b8 * local_1d0;
      local_258 = local_448;
      x = &local_448;
      local_360 = 0;
      local_364 = 0;
      local_368 = 0;
      local_36c = 0;
      local_380 = 0;
      local_388 = 0;
      local_390 = 0;
      local_398 = 0;
      local_3c0 = 0;
      local_3c4 = 0;
      local_3c8 = 0;
      local_3cc = 0;
      local_3e0 = 0;
      local_3e8 = 0;
      local_3f0 = 0;
      local_3f8 = 0;
      local_114 = 0x10;
      local_124 = 0x10;
      local_134 = 0x10;
      local_274 = local_348;
      local_275 = 1;
      local_2dc = local_348;
      local_2dd = 1;
      local_2f4 = local_348;
      local_2f5 = 1;
      local_358 = 0;
      local_370 = 0;
      local_3b8 = 0;
      local_3d0 = 0;
      local_448[0] = 0.0;
      local_448[1] = 0.0;
      local_448[4] = 0.0;
      local_448[5] = 0.0;
      local_448[6] = 0.0;
      local_420 = 0;
      local_41c = 0;
      local_418 = 0;
      local_414 = 0;
      local_410 = 0;
      local_408 = 0;
      local_448[2] = 0.0;
      local_448[3] = 0.0;
      local_400 = this;
      local_288 = x;
      local_1c8 = this;
      local_190 = local_350;
      local_158 = local_3b0;
      local_e0 = x;
      local_c0 = local_298;
      local_a0 = local_2a8;
      local_428 = local_1e0;
      local_3d8 = local_170;
      local_378 = local_1a8;
      for (local_44c = 0; local_44c + 7 < local_344; local_44c = local_44c + 8) {
        local_248 = local_350;
        local_480 = *(undefined8 *)local_350;
        uStack_478 = *(undefined8 *)(local_350 + 2);
        uStack_470 = *(undefined8 *)(local_350 + 4);
        uStack_468 = *(undefined8 *)(local_350 + 6);
        local_250 = local_3b0;
        uVar6 = *(undefined8 *)local_3b0;
        uVar5 = *(undefined8 *)(local_3b0 + 2);
        uVar7 = *(undefined8 *)(local_3b0 + 4);
        uVar8 = *(undefined8 *)(local_3b0 + 6);
        local_4a0 = uVar6;
        uStack_498 = uVar5;
        uStack_490 = uVar7;
        uStack_488 = uVar8;
        BinaryOp_x86_fma_functor::binary_op_add::func_pack8(this,x,in_stack_fffffffffffffa80);
        local_218 = local_400;
        auVar1._8_8_ = uVar5;
        auVar1._0_8_ = uVar6;
        auVar1._16_8_ = uVar7;
        auVar1._24_8_ = uVar8;
        *(undefined1 (*) [32])local_400 = auVar1;
        local_350 = local_350 + 8;
        local_3b0 = local_3b0 + 8;
        local_400 = local_400 + 0x20;
        local_4c0 = uVar6;
        uStack_4b8 = uVar5;
        uStack_4b0 = uVar7;
        uStack_4a8 = uVar8;
        local_240 = uVar6;
        uStack_238 = uVar5;
        uStack_230 = uVar7;
        uStack_228 = uVar8;
      }
      for (; local_44c + 3 < local_344; local_44c = local_44c + 4) {
        local_208 = local_350;
        local_4d0 = *(float (*) [2])local_350;
        afStack_4c8 = *(float (*) [2])(local_350 + 2);
        local_210 = local_3b0;
        local_4e0 = *(float (*) [2])local_3b0;
        uVar6 = *(undefined8 *)(local_3b0 + 2);
        afStack_4d8 = (float  [2])uVar6;
        afVar9 = BinaryOp_x86_fma_functor::binary_op_add::func_pack4
                           (local_329,(__m128 *)local_4d0,(__m128 *)local_4e0);
        local_200 = afVar9._0_8_;
        local_1f0 = local_400;
        auVar2._8_4_ = (float)uVar6;
        auVar2._12_4_ = SUB84(uVar6,4);
        auVar2._0_8_ = local_200;
        *(undefined1 (*) [16])local_400 = auVar2;
        local_350 = local_350 + 4;
        local_3b0 = local_3b0 + 4;
        local_400 = local_400 + 0x10;
        afStack_1f8 = (float  [2])uVar6;
      }
      for (; local_44c < local_344; local_44c = local_44c + 1) {
        fVar4 = BinaryOp_x86_fma_functor::binary_op_add::func(local_329,local_350,local_3b0);
        *(float *)local_400 = fVar4;
        local_350 = local_350 + 1;
        local_3b0 = local_3b0 + 1;
        local_400 = local_400 + 4;
      }
    }
    local_304 = 0;
  }
  return local_304;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}